

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::DummyDataParameter::InternalSerializeWithCachedSizesToArray
          (DummyDataParameter *this,bool deterministic,uint8 *target)

{
  int iVar1;
  Rep *pRVar2;
  void *pvVar3;
  bool bVar4;
  Type *this_00;
  LogMessage *pLVar5;
  Type *this_01;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  int iVar11;
  LogFinisher local_109;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  iVar1 = (this->data_filler_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::FillerParameter>::TypeHandler>
                          (&(this->data_filler_).super_RepeatedPtrFieldBase,iVar11);
      *target = 10;
      pbVar10 = target + 1;
      uVar8 = this_00->_cached_size_;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = FillerParameter::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar10 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  uVar8 = (this->num_).current_size_;
  if (uVar8 != 0) {
    if ((this->num_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_d0,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d0);
    }
    pRVar2 = (this->num_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    do {
      uVar8 = pRVar2->elements[uVar9];
      *target = 0x10;
      pbVar10 = target + 1;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = pbVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  uVar8 = (this->channels_).current_size_;
  if (uVar8 != 0) {
    if ((this->channels_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_98,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_98);
    }
    pRVar2 = (this->channels_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    do {
      uVar8 = pRVar2->elements[uVar9];
      *target = 0x18;
      pbVar10 = target + 1;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = pbVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  uVar8 = (this->height_).current_size_;
  if (uVar8 != 0) {
    if ((this->height_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_60,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    }
    pRVar2 = (this->height_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    do {
      uVar8 = pRVar2->elements[uVar9];
      *target = 0x20;
      pbVar10 = target + 1;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = pbVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  uVar8 = (this->width_).current_size_;
  if (uVar8 != 0) {
    if ((this->width_).rep_ == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_108,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      pLVar5 = google::protobuf::internal::LogMessage::operator<<(&local_108,"CHECK failed: rep_: ")
      ;
      google::protobuf::internal::LogFinisher::operator=(&local_109,pLVar5);
      google::protobuf::internal::LogMessage::~LogMessage(&local_108);
    }
    pRVar2 = (this->width_).rep_;
    uVar7 = 1;
    if (1 < (int)uVar8) {
      uVar7 = (ulong)uVar8;
    }
    uVar9 = 0;
    do {
      uVar8 = pRVar2->elements[uVar9];
      *target = 0x28;
      pbVar10 = target + 1;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = pbVar10 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  iVar1 = (this->shape_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                          (&(this->shape_).super_RepeatedPtrFieldBase,iVar11);
      *target = 0x32;
      pbVar10 = target + 1;
      uVar8 = this_01->_cached_size_;
      uVar6 = uVar8;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar8 | 0x80;
          uVar6 = uVar8 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar4 = 0x3fff < uVar8;
          uVar8 = uVar6;
        } while (bVar4);
      }
      *pbVar10 = (byte)uVar6;
      target = BlobShape::InternalSerializeWithCachedSizesToArray(this_01,false,pbVar10 + 1);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* DummyDataParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.DummyDataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.FillerParameter data_filler = 1;
  for (unsigned int i = 0, n = this->data_filler_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->data_filler(i), deterministic, target);
  }

  // repeated uint32 num = 2;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(2, this->num_, target);

  // repeated uint32 channels = 3;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(3, this->channels_, target);

  // repeated uint32 height = 4;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(4, this->height_, target);

  // repeated uint32 width = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteUInt32ToArray(5, this->width_, target);

  // repeated .caffe.BlobShape shape = 6;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->shape(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.DummyDataParameter)
  return target;
}